

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  __uid_t _Var2;
  __uid_t __uid;
  econf_err error;
  __pid_t _Var3;
  int iVar4;
  uint uVar5;
  uint extraout_EAX;
  int iVar6;
  int extraout_EAX_00;
  undefined8 uVar7;
  char **ppcVar8;
  passwd *__s1;
  passwd *ppVar9;
  int *piVar10;
  size_t sVar11;
  char *pcVar12;
  undefined1 show;
  undefined8 extraout_RDX;
  char *pcVar13;
  econf_file *peVar14;
  char *pcVar15;
  char **ppcVar16;
  char *pcVar17;
  size_t sVar18;
  char **ppcVar19;
  econf_file *key_file_edit;
  char *home_dir;
  uint local_94;
  uint local_90;
  short local_8c;
  undefined1 local_8a;
  char *local_88;
  char **local_80;
  char *local_78;
  char **groupsEdit;
  econf_file **key_files;
  undefined6 uStack_60;
  undefined2 uStack_5a;
  undefined6 uStack_58;
  size_t groupEditCount;
  int index;
  size_t groupCount;
  
  home_dir = (char *)0x0;
  index = 0;
  local_80 = argv;
  root_dir = strdup("/etc");
  usr_root_dir = strdup("/usr/etc");
  conf_dir = strdup("");
  conf_basename = strdup("");
  local_90 = (uint)CONCAT71((int7)((ulong)conf_basename >> 8),1);
  local_78 = "=";
  local_88 = "#";
  local_94 = 0;
  pcVar13 = "hfyuc:d:";
  ppcVar16 = &conf_dir;
  ppcVar19 = local_80;
  do {
    while( true ) {
      uVar7 = getopt_long(argc,ppcVar19,"hfyuc:d:",main::longopts,&index);
      pcVar15 = local_78;
      ppcVar1 = local_80;
      iVar6 = (int)uVar7;
      if (iVar6 != 0x79) break;
      non_interactive = '\x01';
    }
    ppcVar8 = ppcVar16;
    ppcVar19 = local_80;
    switch(iVar6) {
    case 99:
      local_88 = _optarg;
      break;
    case 100:
      local_78 = _optarg;
      break;
    case 0x65:
    case 0x67:
      goto switchD_0010308e_caseD_65;
    case 0x66:
      free(conf_dir);
      iVar6 = asprintf(&conf_dir,"%s","/etc");
      if (iVar6 < 0) goto LAB_00103ab5;
      change_root_dir(&conf_dir);
      local_90 = 0;
      ppcVar19 = local_80;
      break;
    case 0x68:
      usage();
      return 0;
    default:
      if (iVar6 == -1) {
        if (argc < 2) {
          usage();
          return 1;
        }
        if ((argc == 2) || (argc - _optind < 2)) {
          main_cold_31();
          return 1;
        }
        iVar6 = strcmp(local_78,"spaces");
        if (iVar6 == 0) {
          pcVar15 = " \t\f\n\r\v";
        }
        else {
          pcVar13 = replace_str(pcVar15,"\\t","\t");
          pcVar13 = replace_str(pcVar13,"\\f","\f");
          pcVar13 = replace_str(pcVar13,"\\n","\n");
          pcVar13 = replace_str(pcVar13,"\\r","\r");
          pcVar15 = replace_str(pcVar13,"\\v","\v");
        }
        _Var2 = getuid();
        pcVar13 = ppcVar1[(long)_optind + 1];
        if (*(char *)&((passwd *)pcVar13)->pw_name != '/') {
          local_78 = (char *)CONCAT44(local_78._4_4_,_Var2);
          ppcVar8 = (char **)strrchr(pcVar13,0x2e);
          __s1 = (passwd *)pcVar13;
          conf_suffix = (char *)ppcVar8;
          if (ppcVar8 == (char **)0x0) goto LAB_00103abf;
          free(conf_basename);
          pcVar13 = local_80[(long)_optind + 1];
          sVar11 = strlen(pcVar13);
          sVar18 = strlen((char *)ppcVar8);
          conf_basename = strndup(pcVar13,sVar11 - sVar18);
          _Var2 = (__uid_t)local_78;
          if (conf_basename == (char *)0x0) {
            main_cold_2();
            return 1;
          }
        }
        __s1 = (passwd *)strdup(pcVar13);
        conf_filename = (char *)__s1;
        if (__s1 == (passwd *)0x0) goto LAB_00103aba;
        if ((local_90 & 1) != 0) {
          ppcVar16 = &conf_dir;
          free(conf_dir);
          iVar6 = asprintf(&conf_dir,"/etc/%s.d",__s1);
          if (iVar6 < 0) goto LAB_00103ac4;
          change_root_dir(&conf_dir);
        }
        __s1 = (passwd *)conf_filename;
        ppcVar16 = &conf_path;
        free(conf_path);
        pcVar13 = (char *)__s1;
        iVar6 = asprintf(&conf_path,"%s/%s",conf_dir);
        show = SUB81(pcVar13,0);
        if (iVar6 < 0) {
          main_cold_28();
          return 1;
        }
        pcVar13 = getenv("ECONFTOOL_ROOT");
        if (pcVar13 == (char *)0x0) {
          pcVar13 = getenv("HOME");
          ppcVar19 = local_80;
          if (pcVar13 == (char *)0x0) {
            __uid = getuid();
            ppVar9 = getpwuid(__uid);
            if (ppVar9 != (passwd *)0x0) {
              free(home_dir);
              home_dir = strdup(ppVar9->pw_dir);
              __s1 = ppVar9;
              if (home_dir == (char *)0x0) {
                main_cold_5();
                return 1;
              }
            }
          }
          else {
            free(home_dir);
            pcVar13 = getenv("HOME");
            home_dir = strdup(pcVar13);
            if (home_dir == (char *)0x0) {
              main_cold_4();
              return 1;
            }
          }
        }
        else {
          change_root_dir(&home_dir);
          ppcVar19 = local_80;
        }
        pcVar13 = getenv("XDG_CONFIG_HOME");
        if (pcVar13 == (char *)0x0) {
LAB_001033ba:
          iVar6 = asprintf(&xdg_config_dir,"%s/.config",home_dir);
          if (iVar6 < 0) goto LAB_00103ac9;
        }
        else {
          xdg_config_dir = strdup(pcVar13);
          if (xdg_config_dir == (char *)0x0) {
            main_cold_6();
            goto LAB_001033ba;
          }
        }
        free(home_dir);
        change_root_dir(&root_dir);
        change_root_dir(&usr_root_dir);
        __s1 = (passwd *)ppcVar19[_optind];
        iVar6 = strcmp((char *)__s1,"show");
        if (iVar6 == 0) {
          pcVar13 = (char *)0x1;
        }
        else {
          iVar6 = strcmp((char *)__s1,"syntax");
          if (iVar6 != 0) {
            iVar6 = strcmp((char *)__s1,"edit");
            pcVar13 = local_88;
            if (iVar6 == 0) {
              if (_Var2 == 0 && (local_94 & 1) == 0) {
                if ((local_90 & 1) != 0) {
                  free(conf_filename);
                  pcVar17 = "90_econftool.conf";
                  pcVar12 = strdup("90_econftool.conf");
                  conf_filename = pcVar12;
                  if (pcVar12 == (char *)0x0) goto LAB_00103b05;
                  free(conf_path);
                  iVar6 = asprintf(&conf_path,"%s/%s",conf_dir,pcVar12);
                  if (iVar6 < 0) {
                    main_cold_9();
                    return 1;
                  }
                }
              }
              else {
                free(conf_dir);
                conf_dir = strdup(xdg_config_dir);
                pcVar13 = local_88;
                if (conf_dir == (char *)0x0) goto LAB_00103af9;
                change_root_dir(&conf_dir);
                free(conf_path);
                iVar6 = asprintf(&conf_path,"%s/%s",conf_dir,conf_filename);
                if (iVar6 < 0) {
                  main_cold_25();
                  return 1;
                }
              }
              key_file_edit = (econf_file *)0x0;
              if (*conf_filename == '/') {
                iVar6 = econf_readFile(&main::key_file,conf_filename,pcVar15,pcVar13);
              }
              else {
                main::key_file = init_key_file();
                iVar6 = econf_readConfig(&main::key_file,0,0,conf_basename,conf_suffix,pcVar15,
                                         pcVar13);
              }
              if (iVar6 == 0) {
LAB_001036ea:
                ppVar9 = (passwd *)getenv("TMPDIR");
                __s1 = (passwd *)"/tmp";
                if (ppVar9 != (passwd *)0x0) {
                  __s1 = ppVar9;
                }
                key_files = (econf_file **)0x6f63652f706d742f;
                uStack_60 = 0x6c6f6f74666e;
                uStack_5a = 0x582d;
                uStack_58 = 0x5858585858;
                iVar6 = mkstemp((char *)&key_files);
                if (iVar6 == -1) {
                  pcVar13 = "mkstemp() failed";
LAB_001039f3:
                  perror(pcVar13);
LAB_00103a0a:
                  peVar14 = (econf_file *)0x0;
                }
                else {
                  pcVar12 = strdup((char *)&key_files);
                  if (pcVar12 == (char *)0x0) {
                    pcVar13 = "out of memory!";
                    goto LAB_001039f3;
                  }
                  pcVar12 = strdup(pcVar12);
                  if (pcVar12 == (char *)0x0) {
                    main_cold_23();
                    goto LAB_00103a0a;
                  }
                  pcVar17 = strrchr(pcVar12,0x2f);
                  ppcVar16 = (char **)strdup(pcVar17 + 1);
                  if (ppcVar16 == (char **)0x0) {
                    main_cold_22();
                    goto LAB_00103a0a;
                  }
                  getenv("EDITOR");
                  _Var3 = fork();
                  if (_Var3 == 0) goto LAB_00103ad3;
                  if (_Var3 == -1) goto LAB_00103af4;
                  _Var3 = waitpid(_Var3,(int *)&groupsEdit,0);
                  if ((_Var3 == -1) && (piVar10 = __errno_location(), *piVar10 != 4)) {
                    perror("waitpid");
                  }
                  else if (((ulong)groupsEdit & 0x7f) == 0) {
                    iVar6 = econf_readFile(&key_file_edit,pcVar12,pcVar15,pcVar13);
                    if (iVar6 == 0) {
                      remove(pcVar12);
                      key_files = (econf_file **)0x0;
                      groupsEdit = (char **)0x0;
                      groupCount = 0;
                      groupEditCount = 0;
                      iVar6 = econf_getGroups(main::key_file);
                      if (iVar6 != 0) {
                        main_cold_17();
                        goto LAB_00103a38;
                      }
                      iVar6 = econf_getGroups(key_file_edit,&groupEditCount,&groupsEdit);
                      if (iVar6 != 0) {
                        main_cold_18();
                        goto LAB_00103a38;
                      }
                      iVar6 = access(conf_dir,0);
                      if (((iVar6 == -1) && (piVar10 = __errno_location(), *piVar10 == 2)) &&
                         (iVar6 = mkdir(conf_dir,0x1ed), iVar6 != 0)) {
                        perror("mkdir() failed");
                        goto LAB_00103a38;
                      }
                      iVar6 = 0;
                      iVar4 = access(conf_path,0);
                      if ((iVar4 == 0) && (non_interactive == '\0')) {
                        local_8a = 0;
                        local_8c = 0;
                        goto LAB_0010392b;
                      }
                      printf("Writing file %s to %s\n",conf_filename,conf_dir);
                      iVar4 = econf_writeFile(key_file_edit,conf_dir,conf_filename);
                      if (iVar4 == 0) goto LAB_00103a3d;
                      main_cold_21();
                      goto LAB_00103a38;
                    }
                    main_cold_16();
                  }
                  else {
                    main_cold_15();
                  }
                  remove(pcVar12);
                  peVar14 = key_file_edit;
                }
                econf_freeFile(peVar14);
              }
              else if (iVar6 == 3) {
                iVar6 = econf_newIniFile(&main::key_file);
                if (iVar6 == 0) goto LAB_001036ea;
                main_cold_11();
              }
              else {
                main_cold_24();
              }
            }
            else {
              iVar6 = strcmp((char *)__s1,"revert");
              if (iVar6 == 0) {
                iVar6 = econf_revert(_Var2 == 0,(_Bool)((byte)local_94 & 1));
                goto LAB_0010352e;
              }
              iVar6 = strcmp((char *)__s1,"cat");
              if (iVar6 != 0) goto LAB_00103ace;
              key_file_edit = (econf_file *)0x0;
              if (*conf_filename == '/') {
                main_cold_8();
              }
              else {
                error = econf_readDirsHistory
                                  (&key_files,&key_file_edit,usr_root_dir,root_dir,conf_basename,
                                   conf_suffix,pcVar15,local_88);
                if (error == ECONF_SUCCESS) {
                  pr_header();
                  if (key_file_edit != (econf_file *)0x0) {
                    peVar14 = (econf_file *)0x0;
                    do {
                      pr_key_file(key_files[(long)peVar14]);
                      econf_freeFile(key_files[(long)peVar14]);
                      peVar14 = peVar14 + 1;
                    } while (peVar14 < key_file_edit);
                  }
                  free(key_files);
                  iVar6 = 0;
                  goto LAB_0010352e;
                }
                print_error(error);
              }
            }
            iVar6 = -1;
            goto LAB_0010352e;
          }
          pcVar13 = (char *)0x0;
        }
        iVar6 = econf_read((econf_file **)pcVar15,local_88,pcVar13,(_Bool)show);
        goto LAB_0010352e;
      }
      if (iVar6 != 0x75) goto switchD_0010308e_caseD_65;
      local_94 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
    }
  } while( true );
LAB_0010392b:
  fprintf(_stdout,"The file %s/%s already exists!\n",conf_dir,conf_filename);
  fwrite("Do you really want to overwrite it?\nYes [y], no [n]\n",0x34,1,_stdout);
  iVar6 = __isoc99_scanf("%2s",&local_8c);
  if (iVar6 != 1) {
    main_cold_19();
  }
  if (local_8c == 0x79) {
    iVar6 = 0;
    printf("Writing file %s to %s\n",conf_filename,conf_dir);
    iVar4 = econf_writeFile(key_file_edit,conf_dir,conf_filename);
    if (iVar4 != 0) {
      main_cold_20();
LAB_00103a38:
      iVar6 = -1;
    }
    goto LAB_00103a3d;
  }
  if (local_8c == 0x6e) {
    iVar6 = 0;
LAB_00103a3d:
    econf_freeFile(key_file_edit);
    econf_freeArray(groupsEdit);
    econf_freeArray(key_files);
LAB_0010352e:
    econf_freeFile(main::key_file);
    return iVar6;
  }
  goto LAB_0010392b;
switchD_0010308e_caseD_65:
  main_cold_32();
LAB_00103ab5:
  main_cold_1();
LAB_00103aba:
  main_cold_30();
  __s1 = (passwd *)pcVar13;
  ppcVar16 = ppcVar8;
LAB_00103abf:
  main_cold_3();
LAB_00103ac4:
  main_cold_29();
LAB_00103ac9:
  main_cold_27();
LAB_00103ace:
  main_cold_7();
LAB_00103ad3:
  uVar5 = econf_writeFile(main::key_file,__s1,ppcVar16);
  if (uVar5 == 0) {
    main_cold_13();
LAB_00103af4:
    main_cold_14();
LAB_00103af9:
    main_cold_26();
    uVar5 = extraout_EAX;
  }
  pcVar17 = (char *)(ulong)uVar5;
  main_cold_12();
LAB_00103b05:
  main_cold_10();
  pcVar13 = getenv("ECONFTOOL_ROOT");
  if (pcVar13 != (char *)0x0) {
    pcVar15 = *(char **)pcVar17;
    if (pcVar15 == (char *)0x0) {
      pcVar15 = "%s";
      uVar5 = asprintf((char **)pcVar17,"%s",pcVar13);
      pcVar13 = (char *)(ulong)uVar5;
      if ((int)uVar5 < 0) goto LAB_00103bb6;
    }
    else {
      sVar11 = strlen(pcVar13);
      uVar5 = strncmp(pcVar15,pcVar13,(long)(int)sVar11);
      pcVar13 = (char *)(ulong)uVar5;
      if (uVar5 != 0) {
        pcVar13 = strdup(pcVar15);
        free(pcVar15);
        pcVar12 = getenv("ECONFTOOL_ROOT");
        pcVar15 = "%s%s";
        iVar6 = asprintf((char **)pcVar17,"%s%s",pcVar12,pcVar13);
        if (-1 < iVar6) {
          free(pcVar13);
          return extraout_EAX_00;
        }
        change_root_dir_cold_1();
LAB_00103bb6:
        change_root_dir_cold_2();
        pcVar13 = strstr(pcVar17,pcVar15);
        if (pcVar13 != (char *)0x0) {
          sVar18 = (long)pcVar13 - (long)pcVar17;
          strncpy(replace_str::buffer,pcVar17,sVar18);
          replace_str::buffer[sVar18] = '\0';
          sVar11 = strlen(pcVar15);
          sprintf(replace_str::buffer + sVar18,"%s%s",extraout_RDX,pcVar13 + sVar11);
          pcVar17 = replace_str::buffer;
        }
        return (int)pcVar17;
      }
    }
  }
  return (int)pcVar13;
}

Assistant:

int main (int argc, char *argv[])
{
    static const char *dropin_filename = "90_econftool.conf";
    static econf_file *key_file = NULL;
    char *home_dir = NULL; /* the path of the home directory */
    bool is_dropin_file = true;
    bool is_root = false;
    bool use_homedir = false;
    char *comment = "#";
    char *delimiters = "=";

    /* parse command line arguments. See getopt_long(3) */
    int opt, nonopts;

    int index = 0;
    static struct option longopts[] = {
    /*   name,     arguments,      flag, value */
        {"full",        no_argument,       0, 'f'},
        {"help",        no_argument,       0, 'h'},
        {"yes",         no_argument,       0, 'y'},
        {"use-home",    no_argument,       0, 'u'},
	{"comment",     required_argument, 0, 'c'},
	{"delimiters",  required_argument, 0, 'd'},
        {0,             0,                 0,  0 }
    };

    root_dir = strdup("/etc");
    usr_root_dir = strdup("/usr/etc");
    conf_dir = strdup("");
    conf_basename = strdup("");

    while ((opt = getopt_long(argc, argv, "hfyuc:d:", longopts, &index)) != -1) {
        switch(opt) {
        case 'f':
            /* overwrite path */
	    free(conf_dir);
            if (asprintf(&conf_dir, "%s", "/etc") < 0) {
		fprintf(stderr, "Out of memory!\n");
		exit(EXIT_FAILURE);
	    }
            change_root_dir(&conf_dir);
            is_dropin_file = false;
            break;
        case 'h':
            usage();
            return EXIT_SUCCESS;
        case 'y':
            non_interactive = true;
            break;
        case 'u':
            use_homedir = true;
            break;
	case 'c':
	    comment = optarg;
	    break;
	case 'd':
	    delimiters = optarg;
	    break;
        case '?':
        default:
            fprintf(stderr, "Try '%s --help' for more information.\n", utilname);
            exit(EXIT_FAILURE);
            break;
        }
    }
    nonopts = argc - optind;

    /* only do something if we have an input */
    if (argc < 2) {
        usage();
        return EXIT_FAILURE;
    } else if (argc < 3 || nonopts < 2) {
        fprintf(stderr, "Invalid number of Arguments\n\n");
        usage();
        return EXIT_FAILURE;
    }

    /* translating delimiters */
    if ( strcmp(delimiters, "spaces") == 0 ) {
      delimiters = " \t\f\n\r\v";
    } else {
      delimiters = replace_str(delimiters, "\\t", "\t");
      delimiters = replace_str(delimiters, "\\f", "\f");
      delimiters = replace_str(delimiters, "\\n", "\n");
      delimiters = replace_str(delimiters, "\\r", "\r");
      delimiters = replace_str(delimiters, "\\v", "\v");
    }

    /**** initialization ****/
    /* basic write permission check */
    is_root = getuid() == 0;

    if ( argv[optind + 1][0] != '/') {
	/* it is not a single file only */

        /* get the position of the last dot in the filename to extract
         * the suffix from it.
         */
        conf_suffix = strrchr(argv[optind + 1], '.');
        if (conf_suffix == NULL) {
            fprintf(stderr, "Currently only works with a dot in the filename and a suffix!\n\n");
	    usage();
	    exit(1);
	} else {
            /* set filename to the proper argv argument */
            free(conf_basename);
	    conf_basename = strndup(argv[optind + 1], strlen(argv[optind + 1]) - strlen(conf_suffix));
	    if (conf_basename == NULL) {
	        fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
	}
    }

    conf_filename = strdup(argv[optind + 1]);
    if (conf_filename == NULL) {
	fprintf(stderr, "Out of memory!\n");
	exit(EXIT_FAILURE);
    }

    if (is_dropin_file) {
        free(conf_dir);
        if (asprintf(&conf_dir, "/etc/%s.d", conf_filename) < 0) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
        }
        change_root_dir(&conf_dir);
    }

    free(conf_path);
    if (asprintf(&conf_path, "%s/%s", conf_dir, conf_filename) < 0) {
	fprintf(stderr, "Out of memory!\n");
	return EXIT_FAILURE;
    }

    if (getenv("ECONFTOOL_ROOT") == NULL)
        if (getenv("HOME") != NULL) {
	    free(home_dir);
	    home_dir = strdup(getenv("HOME"));
	    if (home_dir == NULL) {
		fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
        } else {
            struct passwd *pw = getpwuid(getuid());
            if(pw) {
		free (home_dir);
		home_dir = strdup(pw->pw_dir);
		if (home_dir == NULL) {
		    fprintf(stderr, "Out of memory!\n");
		    return EXIT_FAILURE;
		}
	    }
        }
    else
        change_root_dir(&home_dir);

    if (getenv("XDG_CONFIG_HOME") == NULL) {
        /* if no XDG_CONFIG_HOME is specified take ~/.config as default */
        if (asprintf(&xdg_config_dir, "%s/.config", home_dir) < 0) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
        }
    } else {
        xdg_config_dir = strdup(getenv("XDG_CONFIG_HOME"));
	if (xdg_config_dir == NULL) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
        }
    }

    free(home_dir);

    /* Change Root dirs */
    change_root_dir(&root_dir);
    change_root_dir(&usr_root_dir);

    int ret = 0;
    if (strcmp(argv[optind], "show") == 0) {
      ret = econf_read(&key_file, delimiters, comment, true);
    } else if (strcmp(argv[optind], "syntax") == 0) {
      ret = econf_read(&key_file, delimiters, comment, false);
    } else if (strcmp(argv[optind], "edit") == 0) {
        if (!is_root || use_homedir) {
            /* adjust path to home directory of the user.*/
            free(conf_dir);
	    conf_dir = strdup(xdg_config_dir);
	    if (conf_dir == NULL) {
	        fprintf(stderr, "Out of memory!\n");
		exit(EXIT_FAILURE);
	    }
            change_root_dir(&conf_dir);
	    free(conf_path);
	    if (asprintf(&conf_path, "%s/%s", conf_dir, conf_filename) < 0) {
		fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
        } else if(is_dropin_file) {
	    free(conf_filename);
	    conf_filename = strdup(dropin_filename);
	    if (conf_filename == NULL) {
	        fprintf(stderr, "Out of memory!\n");
		exit(EXIT_FAILURE);
	    }
	    free(conf_path);
	    if (asprintf(&conf_path, "%s/%s", conf_dir, conf_filename) < 0) {
		fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
	}

        ret = econf_edit(&key_file, delimiters, comment);
    } else if (strcmp(argv[optind], "revert") == 0) {
      ret = econf_revert(is_root, use_homedir);
    } else if (strcmp(argv[optind], "cat") == 0) {
	ret = econf_cat(delimiters, comment);
    } else {
        fprintf(stderr, "Unknown command!\n\n");
        usage();
        exit(EXIT_FAILURE);
    }

    /* cleanup */
    econf_free(key_file);
    return ret;
}